

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O2

void rtp_pkt_init(rtp_pkt_t *pkt)

{
  uint uVar1;
  
  if (pkt != (rtp_pkt_t *)0x0) {
    pkt->b = (rtp_bits_t)((uint)(byte)(pkt->b).field_0x1 << 8 | 2);
    uVar1 = rand();
    pkt->ssrc = (ulong)uVar1;
    pkt->length = 0;
    pkt->plen = '\0';
    pkt->hlen = 0xc;
    pkt->payload = pkt->data + 0xc;
    pkt->pack = (_func_void_rtp_pkt_s_ptr *)0x0;
    pkt->unpack = (_func_int_rtp_pkt_s_ptr *)0x0;
    return;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0x26,"void rtp_pkt_init(rtp_pkt_t *)");
}

Assistant:

void rtp_pkt_init(rtp_pkt_t *pkt) {
  assert(pkt != NULL);

  /*M
    RTP version 2.
  **/
  pkt->b.v = 2;
  /*M
    We use no padding (at first).
  **/
  pkt->b.p = 0;
  /*M
    No extensions (at first).
  **/
  pkt->b.x = 0;
  /*M
    No csrc identifiers at first.
  **/
  pkt->b.cc = 0;
  /*M
    Set the sequence number to 0.
  **/
  pkt->b.seq = 0;
  /*M
    Generate a random synchronization source.
  **/
  pkt->ssrc  = ((unsigned int)rand()) & 0xFFFFFFFF;
  /*M
    The payload length is $0$ at first.
  **/
  pkt->length = 0;
  
  /*M
    The padding length is $0$ at first.
  **/
  pkt->plen = 0;

  pkt->hlen = RTP_HDR_SIZE;
  pkt->payload = pkt->data + pkt->hlen;

  pkt->pack = NULL;
  pkt->unpack = NULL;
}